

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::DefaultAtomVisitor::visit(DefaultAtomVisitor *this,DirectionalAtom *datom)

{
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  AtomType *this_00;
  DataStoragePointer DVar4;
  SnapshotManager *pSVar5;
  Snapshot *pSVar6;
  RealType RVar7;
  double dVar8;
  AtomInfo *this_01;
  AtomInfo *pAVar9;
  bool bVar10;
  uint i_2;
  AtomInfo **ppAVar11;
  uint i;
  long lVar12;
  long lVar13;
  string *psVar14;
  uint j_1;
  AtomInfo **ppAVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  BaseAtomVisitor *this_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_04;
  double (*padVar16) [3];
  string *psVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Vector<double,_3U> result_1;
  SquareMatrix3<double> result;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  GayBerneAdapter gba;
  FluctuatingChargeAdapter fqa;
  undefined8 local_128;
  undefined8 uStack_120;
  double local_118;
  AtomInfo *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  undefined1 local_f8 [80];
  BaseAtomVisitor *local_a8;
  value_type local_a0;
  FixedChargeAdapter local_90;
  GayBerneAdapter local_88;
  FluctuatingChargeAdapter local_80;
  double local_78 [9];
  
  this_00 = (datom->super_Atom).atomType_;
  bVar10 = BaseAtomVisitor::isVisited(&this->super_BaseAtomVisitor,&datom->super_Atom);
  if (bVar10) {
    this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0021c206;
  }
  local_108 = (AtomInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
            (&_Stack_100,&local_108,(allocator<OpenMD::AtomInfo> *)local_78);
  this_02._M_pi = _Stack_100._M_pi;
  this_01 = local_108;
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (AtomInfo *)0x0;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_108,datom);
  psVar17 = (string *)&local_108;
  std::__cxx11::string::operator=((string *)this_01,psVar17);
  if (local_108 != (AtomInfo *)local_f8) {
    operator_delete(local_108,(ulong)(local_f8._0_8_ + 1));
  }
  this_01->globalID = (datom->super_Atom).super_StuntDouble.globalIndex_;
  DVar4 = (datom->super_Atom).super_StuntDouble.storage_;
  pSVar5 = (datom->super_Atom).super_StuntDouble.snapshotMan_;
  pSVar6 = pSVar5->currentSnapshot_;
  lVar13 = *(long *)((long)&(pSVar6->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  lVar12 = (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 0x18;
  pdVar1 = (double *)(lVar13 + lVar12);
  dVar3 = *pdVar1;
  dVar8 = pdVar1[1];
  (this_01->pos).super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar12);
  (this_01->pos).super_Vector<double,_3U>.data_[0] = dVar3;
  (this_01->pos).super_Vector<double,_3U>.data_[1] = dVar8;
  lVar13 = *(long *)((long)&(pSVar6->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  pdVar1 = (double *)(lVar13 + lVar12);
  dVar3 = *pdVar1;
  dVar8 = pdVar1[1];
  (this_01->vel).super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar12);
  (this_01->vel).super_Vector<double,_3U>.data_[0] = dVar3;
  (this_01->vel).super_Vector<double,_3U>.data_[1] = dVar8;
  lVar13 = *(long *)((long)&(pSVar5->currentSnapshot_->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  pdVar1 = (double *)(lVar13 + lVar12);
  dVar3 = *pdVar1;
  dVar8 = pdVar1[1];
  (this_01->frc).super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar12);
  (this_01->frc).super_Vector<double,_3U>.data_[0] = dVar3;
  (this_01->frc).super_Vector<double,_3U>.data_[1] = dVar8;
  this_01->hasVelocity = true;
  this_01->hasForce = true;
  this_01->hasGlobalID = true;
  local_90.at_ = this_00;
  bVar10 = FixedChargeAdapter::isFixedCharge(&local_90);
  if (bVar10) {
    this_01->hasCharge = true;
    RVar7 = FixedChargeAdapter::getCharge(&local_90);
    this_01->charge = RVar7;
  }
  local_80.at_ = this_00;
  bVar10 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_80);
  if (bVar10) {
    this_01->hasCharge = true;
    this_01->charge =
         *(double *)
          (*(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->currentSnapshot_
                            ->atomData).flucQPos.super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (datom->super_Atom).super_StuntDouble.storage_) +
          (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 8) + this_01->charge;
  }
  if ((((this->super_BaseAtomVisitor).storageLayout_ & 0x1000) != 0) &&
     (bVar10 = AtomType::isElectrostatic(this_00), bVar10)) {
    this_01->hasElectricField = true;
    lVar13 = *(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->
                               currentSnapshot_->atomData).electricField.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (datom->super_Atom).super_StuntDouble.storage_);
    lVar12 = (long)(datom->super_Atom).super_StuntDouble.localIndex_;
    pdVar1 = (double *)(lVar13 + lVar12 * 0x18);
    dVar3 = *pdVar1;
    dVar8 = pdVar1[1];
    (this_01->eField).super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar12 * 0x18)
    ;
    (this_01->eField).super_Vector<double,_3U>.data_[0] = dVar3;
    (this_01->eField).super_Vector<double,_3U>.data_[1] = dVar8;
  }
  local_f8._64_8_ = this_00;
  local_88.at_ = this_00;
  bVar10 = GayBerneAdapter::isGayBerne(&local_88);
  if (bVar10) {
    this_01->hasVector = true;
    padVar16 = (double (*) [3])local_78;
    StuntDouble::getA((RotMat3x3d *)padVar16,(StuntDouble *)datom);
    ppAVar11 = &local_108;
    local_f8._32_8_ = 0;
    local_f8._40_8_ = 0.0;
    local_f8._16_8_ = 0;
    local_f8._24_8_ = 0;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = 0;
    local_108 = (AtomInfo *)0x0;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._48_8_ = 0.0;
    lVar13 = 0;
    do {
      lVar12 = 0;
      ppAVar15 = ppAVar11;
      do {
        *ppAVar15 = (AtomInfo *)
                    (((SquareMatrix<double,_3> *)*padVar16)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar12];
        lVar12 = lVar12 + 1;
        ppAVar15 = ppAVar15 + 3;
      } while (lVar12 != 3);
      lVar13 = lVar13 + 1;
      ppAVar11 = ppAVar11 + 1;
      padVar16 = padVar16 + 1;
    } while (lVar13 != 3);
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0.0;
    ppAVar11 = &local_108;
    lVar13 = 0;
    do {
      dVar3 = (double)(&local_128)[lVar13];
      lVar12 = 0;
      do {
        dVar3 = dVar3 + *(double *)((long)ppAVar11 + lVar12) *
                        *(double *)((long)&OpenMD::V3Z + lVar12);
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x18);
      (&local_128)[lVar13] = dVar3;
      lVar13 = lVar13 + 1;
      ppAVar11 = ppAVar11 + 3;
    } while (lVar13 != 3);
LAB_0021bfa3:
    (this_01->vec).super_Vector<double,_3U>.data_[2] = local_118;
    uVar18 = (undefined4)local_128;
    uVar19 = local_128._4_4_;
    uVar20 = (undefined4)uStack_120;
    uVar21 = uStack_120._4_4_;
LAB_0021bffa:
    *(undefined4 *)(this_01->vec).super_Vector<double,_3U>.data_ = uVar18;
    *(undefined4 *)((long)(this_01->vec).super_Vector<double,_3U>.data_ + 4) = uVar19;
    *(undefined4 *)((this_01->vec).super_Vector<double,_3U>.data_ + 1) = uVar20;
    *(undefined4 *)((long)(this_01->vec).super_Vector<double,_3U>.data_ + 0xc) = uVar21;
  }
  else {
    bVar10 = MultipoleAdapter::isDipole((MultipoleAdapter *)(local_f8 + 0x40));
    if (bVar10) {
      this_01->hasVector = true;
      lVar13 = *(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->
                                 currentSnapshot_->atomData).dipole.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (datom->super_Atom).super_StuntDouble.storage_);
      lVar12 = (long)(datom->super_Atom).super_StuntDouble.localIndex_;
      puVar2 = (undefined4 *)(lVar13 + lVar12 * 0x18);
      uVar18 = *puVar2;
      uVar19 = puVar2[1];
      uVar20 = puVar2[2];
      uVar21 = puVar2[3];
      (this_01->vec).super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar12 * 0x18);
      goto LAB_0021bffa;
    }
    bVar10 = MultipoleAdapter::isQuadrupole((MultipoleAdapter *)(local_f8 + 0x40));
    if (bVar10) {
      this_01->hasVector = true;
      padVar16 = (double (*) [3])local_78;
      StuntDouble::getA((RotMat3x3d *)padVar16,(StuntDouble *)datom);
      local_f8._32_8_ = 0;
      local_f8._40_8_ = 0.0;
      local_f8._16_8_ = 0;
      local_f8._24_8_ = 0;
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = 0;
      local_108 = (AtomInfo *)0x0;
      _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f8._48_8_ = 0.0;
      lVar13 = 0;
      do {
        lVar12 = 0;
        psVar14 = psVar17;
        do {
          *(double *)psVar14 =
               (((SquareMatrix<double,_3> *)*padVar16)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar12];
          lVar12 = lVar12 + 1;
          psVar14 = psVar14 + 0x18;
        } while (lVar12 != 3);
        lVar13 = lVar13 + 1;
        psVar17 = psVar17 + 8;
        padVar16 = padVar16 + 1;
      } while (lVar13 != 3);
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0.0;
      ppAVar11 = &local_108;
      lVar13 = 0;
      do {
        dVar3 = (double)(&local_128)[lVar13];
        lVar12 = 0;
        do {
          dVar3 = dVar3 + *(double *)((long)ppAVar11 + lVar12) *
                          *(double *)((long)&OpenMD::V3Z + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 != 0x18);
        (&local_128)[lVar13] = dVar3;
        lVar13 = lVar13 + 1;
        ppAVar11 = ppAVar11 + 3;
      } while (lVar13 != 3);
      goto LAB_0021bfa3;
    }
  }
  local_108 = (AtomInfo *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
            (&_Stack_100,(AtomData **)&local_108,(allocator<OpenMD::AtomData> *)local_78);
  this_04._M_pi = _Stack_100._M_pi;
  pAVar9 = local_108;
  _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (AtomInfo *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ATOMDATA","");
  std::__cxx11::string::_M_assign((string *)&(pAVar9->atomTypeName)._M_string_length);
  if (local_108 != (AtomInfo *)local_f8) {
    operator_delete(local_108,(ulong)(local_f8._0_8_ + 1));
  }
  local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_02._M_pi;
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
             *)&pAVar9->pos,&local_a0);
  if (local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_f8._72_8_ = pAVar9;
  local_a8 = (BaseAtomVisitor *)this_04._M_pi;
  if ((BaseAtomVisitor *)this_04._M_pi != (BaseAtomVisitor *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)&(this_04._M_pi)->_M_use_count)->_M_dataplus)._M_p =
           *(int *)&(((string *)&(this_04._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)&(this_04._M_pi)->_M_use_count)->_M_dataplus)._M_p =
           *(int *)&(((string *)&(this_04._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
    }
  }
  StuntDouble::addProperty
            ((StuntDouble *)datom,(shared_ptr<OpenMD::GenericData> *)(local_f8 + 0x48));
  this_03 = local_a8;
  if (local_a8 != (BaseAtomVisitor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8);
  }
  BaseAtomVisitor::setVisited(this_03,&datom->super_Atom);
LAB_0021c206:
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  if ((BaseAtomVisitor *)this_04._M_pi != (BaseAtomVisitor *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04._M_pi);
  }
  return;
}

Assistant:

void DefaultAtomVisitor::visit(DirectionalAtom* datom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    AtomType* atype = datom->getAtomType();

    if (isVisited(datom)) return;

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = datom->getType();
    atomInfo->globalID     = datom->getGlobalIndex();
    atomInfo->pos          = datom->getPos();
    atomInfo->vel          = datom->getVel();
    atomInfo->frc          = datom->getFrc();
    atomInfo->hasVelocity  = true;
    atomInfo->hasForce     = true;
    atomInfo->hasGlobalID  = true;

    FixedChargeAdapter fca = FixedChargeAdapter(atype);
    if (fca.isFixedCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge    = fca.getCharge();
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
    if (fqa.isFluctuatingCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge += datom->getFlucQPos();
    }

    if ((storageLayout_ & DataStorage::dslElectricField) &&
        (atype->isElectrostatic())) {
      atomInfo->hasElectricField = true;
      atomInfo->eField           = datom->getElectricField();
    }

    GayBerneAdapter gba = GayBerneAdapter(atype);
    MultipoleAdapter ma = MultipoleAdapter(atype);

    if (gba.isGayBerne()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    } else if (ma.isDipole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getDipole();
    } else if (ma.isQuadrupole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    }

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    datom->addProperty(atomData);

    setVisited(datom);
  }